

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

bool DoGiveInventory(AActor *receiver,bool orresult,VMValue *param,
                    TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  AActor *pAVar4;
  AInventory *this;
  int iVar5;
  char *pcVar6;
  int iVar7;
  PClassActor *type;
  
  if (numparam < 2) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003e0710;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003e06b0:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e0710:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x944,
                  "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003e0584;
    bVar2 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar2) {
      pcVar6 = "mi == NULL || mi->IsDescendantOf(RUNTIME_CLASS(AInventory))";
      goto LAB_003e0710;
    }
    bVar2 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003e06b0;
LAB_003e0584:
    bVar2 = true;
    type = (PClassActor *)0x0;
  }
  if (numparam == 2) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e06d2:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x945,
                    "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar7 = param[2].field_0.i;
    if (orresult) goto LAB_003e05fa;
LAB_003e05e0:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e06f1:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x949,
                    "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e06d2;
    }
    iVar7 = param[2].field_0.i;
    if (orresult) goto LAB_003e05fa;
    if ((uint)numparam < 4) {
      param = defaultparam->Array;
      goto LAB_003e05e0;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e06f1;
    }
  }
  receiver = COPY_AAPTR(receiver,param[3].field_0.i);
LAB_003e05fa:
  if ((receiver != (AActor *)0x0) &&
     ((bVar3 = DObject::IsKindOf((DObject *)receiver,AInventory::RegistrationInfo.MyClass), !bVar3
      || (pAVar4 = GC::ReadBarrier<AActor>((AActor **)(receiver + 1)), pAVar4 == (AActor *)0x0)))) {
    iVar5 = 1;
    if (1 < iVar7) {
      iVar5 = iVar7;
    }
    if ((!bVar2) && (this = (AInventory *)Spawn(type), this != (AInventory *)0x0)) {
      bVar2 = DObject::IsKindOf((DObject *)this,AHealth::RegistrationInfo.MyClass);
      if (bVar2) {
        iVar5 = iVar5 * this->Amount;
      }
      this->Amount = iVar5;
      pbVar1 = (byte *)((long)&(this->super_AActor).flags.Value + 2);
      *pbVar1 = *pbVar1 | 2;
      AActor::ClearCounters((AActor *)this);
      bVar2 = AInventory::CallTryPickup(this,receiver,(AActor **)0x0);
      if (bVar2) {
        return true;
      }
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
    }
  }
  return false;
}

Assistant:

static bool DoGiveInventory(AActor *receiver, bool orresult, VM_ARGS)
{
	int paramnum = 0;
	PARAM_CLASS		(mi, AInventory);
	PARAM_INT_DEF	(amount)

	if (!orresult)
	{
		PARAM_INT_DEF(setreceiver)
		receiver = COPY_AAPTR(receiver, setreceiver);
	}
	if (receiver == NULL)
	{ // If there's nothing to receive it, it's obviously a fail, right?
		return false;
	}
	// Owned inventory items cannot own anything because their Inventory pointer is repurposed for the owner's linked list.
	if (receiver->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(receiver)->Owner != nullptr)
	{
		return false;
	}

	if (amount <= 0)
	{
		amount = 1;
	}
	if (mi) 
	{
		AInventory *item = static_cast<AInventory *>(Spawn(mi));
		if (item == NULL)
		{
			return false;
		}
		if (item->IsKindOf(RUNTIME_CLASS(AHealth)))
		{
			item->Amount *= amount;
		}
		else
		{
			item->Amount = amount;
		}
		item->flags |= MF_DROPPED;
		item->ClearCounters();
		if (!item->CallTryPickup(receiver))
		{
			item->Destroy();
			return false;
		}
		else
		{
			return true;
		}
	}
	return false;
}